

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdef_block_simd.h
# Opt level: O2

void cdef_filter_16_1_sse4_1
               (void *dest,int dstride,uint16_t *in,int pri_strength,int sec_strength,int dir,
               int pri_damping,int sec_damping,int coeff_shift,int block_width,int block_height)

{
  short *psVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  int iVar10;
  uint16_t uVar11;
  uint16_t uVar12;
  uint16_t uVar13;
  uint16_t uVar14;
  uint16_t uVar15;
  uint16_t uVar16;
  uint16_t uVar17;
  uint16_t uVar18;
  uint16_t uVar19;
  uint16_t uVar20;
  uint16_t uVar21;
  uint16_t uVar22;
  uint16_t uVar23;
  uint16_t uVar24;
  uint16_t uVar25;
  uint16_t uVar26;
  long lVar27;
  long lVar28;
  uint uVar29;
  long lVar30;
  long lVar31;
  bool bVar32;
  undefined1 auVar33 [16];
  ulong uVar34;
  undefined1 in_XMM2 [16];
  undefined1 auVar35 [16];
  short sVar36;
  short sVar37;
  short sVar38;
  short sVar39;
  short sVar40;
  short sVar41;
  short sVar42;
  short sVar43;
  short sVar44;
  short sVar45;
  short sVar46;
  short sVar47;
  short sVar48;
  short sVar49;
  short sVar50;
  short sVar51;
  short sVar53;
  short sVar59;
  short sVar61;
  short sVar63;
  short sVar65;
  short sVar67;
  short sVar69;
  undefined1 in_XMM5 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  short sVar71;
  short sVar72;
  short sVar76;
  short sVar77;
  short sVar78;
  short sVar79;
  short sVar80;
  short sVar81;
  undefined1 in_XMM6 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  short sVar82;
  undefined1 in_XMM7 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 in_XMM8 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  short sVar108;
  undefined1 in_XMM9 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  short sVar109;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 in_XMM10 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 in_XMM14 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  ushort uVar52;
  ushort uVar58;
  ushort uVar60;
  ushort uVar62;
  ushort uVar64;
  ushort uVar66;
  ushort uVar68;
  ushort uVar70;
  ushort uVar119;
  ushort uVar125;
  ushort uVar126;
  ushort uVar127;
  ushort uVar128;
  ushort uVar129;
  ushort uVar130;
  ushort uVar131;
  
  bVar32 = ((uint)pri_strength >> (coeff_shift & 0x1fU) & 1) != 0;
  lVar27 = (long)cdef_directions_padded[(long)dir + 2][0];
  lVar28 = (long)cdef_directions_padded[(long)dir + 2][1];
  if (block_width == 8) {
    uVar29 = pri_damping;
    if (pri_strength != 0) {
      iVar10 = 0x1f;
      if (pri_strength != 0) {
        for (; (uint)pri_strength >> iVar10 == 0; iVar10 = iVar10 + -1) {
        }
      }
      uVar29 = pri_damping - iVar10;
      if (pri_damping < iVar10) {
        uVar29 = 0;
      }
    }
    auVar33 = pshuflw(ZEXT416((uint)pri_strength),ZEXT416((uint)pri_strength),0);
    auVar35._0_4_ = auVar33._0_4_;
    auVar35._4_4_ = auVar35._0_4_;
    auVar35._8_4_ = auVar35._0_4_;
    auVar35._12_4_ = auVar35._0_4_;
    lVar30 = 0;
    auVar33 = pmovsxbw(in_XMM2,0x808080808080808);
    for (; lVar30 < block_height; lVar30 = lVar30 + 2) {
      uVar11 = *in;
      uVar12 = in[1];
      uVar13 = in[2];
      uVar14 = in[3];
      uVar15 = in[4];
      uVar16 = in[5];
      uVar17 = in[6];
      uVar18 = in[7];
      uVar19 = in[0x90];
      uVar20 = in[0x91];
      uVar21 = in[0x92];
      uVar22 = in[0x93];
      uVar23 = in[0x94];
      uVar24 = in[0x95];
      uVar25 = in[0x96];
      uVar26 = in[0x97];
      auVar54 = lddqu(in_XMM5,*(undefined1 (*) [16])(in + lVar27));
      auVar73 = lddqu(in_XMM6,*(undefined1 (*) [16])(in + lVar27 + 0x90));
      auVar87 = lddqu(in_XMM8,*(undefined1 (*) [16])(in + -lVar27));
      auVar83 = lddqu(in_XMM7,*(undefined1 (*) [16])(in + (0x90 - lVar27)));
      auVar55._0_2_ = auVar54._0_2_ - uVar11;
      auVar55._2_2_ = auVar54._2_2_ - uVar12;
      auVar55._4_2_ = auVar54._4_2_ - uVar13;
      auVar55._6_2_ = auVar54._6_2_ - uVar14;
      auVar55._8_2_ = auVar54._8_2_ - uVar15;
      auVar55._10_2_ = auVar54._10_2_ - uVar16;
      auVar55._12_2_ = auVar54._12_2_ - uVar17;
      auVar55._14_2_ = auVar54._14_2_ - uVar18;
      auVar74._0_2_ = auVar73._0_2_ - uVar19;
      auVar74._2_2_ = auVar73._2_2_ - uVar20;
      auVar74._4_2_ = auVar73._4_2_ - uVar21;
      auVar74._6_2_ = auVar73._6_2_ - uVar22;
      auVar74._8_2_ = auVar73._8_2_ - uVar23;
      auVar74._10_2_ = auVar73._10_2_ - uVar24;
      auVar74._12_2_ = auVar73._12_2_ - uVar25;
      auVar74._14_2_ = auVar73._14_2_ - uVar26;
      auVar120 = pabsw(in_XMM11,auVar55);
      auVar54 = psraw(auVar55,0xf);
      auVar132 = pabsw(in_XMM12,auVar74);
      auVar73 = psraw(auVar74,0xf);
      uVar34 = (ulong)uVar29;
      uVar52 = auVar120._0_2_;
      auVar95._0_2_ = uVar52 >> uVar34;
      uVar58 = auVar120._2_2_;
      auVar95._2_2_ = uVar58 >> uVar34;
      uVar60 = auVar120._4_2_;
      auVar95._4_2_ = uVar60 >> uVar34;
      uVar62 = auVar120._6_2_;
      auVar95._6_2_ = uVar62 >> uVar34;
      uVar64 = auVar120._8_2_;
      auVar95._8_2_ = uVar64 >> uVar34;
      uVar66 = auVar120._10_2_;
      auVar95._10_2_ = uVar66 >> uVar34;
      uVar68 = auVar120._12_2_;
      uVar70 = auVar120._14_2_;
      auVar95._12_2_ = uVar68 >> uVar34;
      auVar95._14_2_ = uVar70 >> uVar34;
      uVar119 = auVar132._0_2_;
      auVar136._0_2_ = uVar119 >> uVar34;
      uVar125 = auVar132._2_2_;
      auVar136._2_2_ = uVar125 >> uVar34;
      uVar126 = auVar132._4_2_;
      auVar136._4_2_ = uVar126 >> uVar34;
      uVar127 = auVar132._6_2_;
      auVar136._6_2_ = uVar127 >> uVar34;
      uVar128 = auVar132._8_2_;
      auVar136._8_2_ = uVar128 >> uVar34;
      uVar129 = auVar132._10_2_;
      auVar136._10_2_ = uVar129 >> uVar34;
      uVar130 = auVar132._12_2_;
      uVar131 = auVar132._14_2_;
      auVar136._12_2_ = uVar130 >> uVar34;
      auVar136._14_2_ = uVar131 >> uVar34;
      auVar110 = psubusw(auVar35,auVar95);
      auVar96 = psubusw(auVar35,auVar136);
      sVar44 = auVar110._0_2_;
      sVar45 = auVar110._2_2_;
      sVar46 = auVar110._4_2_;
      sVar47 = auVar110._6_2_;
      sVar48 = auVar110._8_2_;
      sVar49 = auVar110._10_2_;
      sVar50 = auVar110._12_2_;
      sVar51 = auVar110._14_2_;
      sVar36 = auVar96._0_2_;
      sVar37 = auVar96._2_2_;
      sVar38 = auVar96._4_2_;
      sVar39 = auVar96._6_2_;
      sVar40 = auVar96._8_2_;
      sVar41 = auVar96._10_2_;
      sVar42 = auVar96._12_2_;
      sVar43 = auVar96._14_2_;
      auVar111._0_2_ =
           (((short)uVar52 < sVar44) * uVar52 | (ushort)((short)uVar52 >= sVar44) * sVar44) +
           auVar54._0_2_;
      auVar111._2_2_ =
           (((short)uVar58 < sVar45) * uVar58 | (ushort)((short)uVar58 >= sVar45) * sVar45) +
           auVar54._2_2_;
      auVar111._4_2_ =
           (((short)uVar60 < sVar46) * uVar60 | (ushort)((short)uVar60 >= sVar46) * sVar46) +
           auVar54._4_2_;
      auVar111._6_2_ =
           (((short)uVar62 < sVar47) * uVar62 | (ushort)((short)uVar62 >= sVar47) * sVar47) +
           auVar54._6_2_;
      auVar111._8_2_ =
           (((short)uVar64 < sVar48) * uVar64 | (ushort)((short)uVar64 >= sVar48) * sVar48) +
           auVar54._8_2_;
      auVar111._10_2_ =
           (((short)uVar66 < sVar49) * uVar66 | (ushort)((short)uVar66 >= sVar49) * sVar49) +
           auVar54._10_2_;
      auVar111._12_2_ =
           (((short)uVar68 < sVar50) * uVar68 | (ushort)((short)uVar68 >= sVar50) * sVar50) +
           auVar54._12_2_;
      auVar111._14_2_ =
           (((short)uVar70 < sVar51) * uVar70 | (ushort)((short)uVar70 >= sVar51) * sVar51) +
           auVar54._14_2_;
      auVar97._0_2_ =
           (((short)uVar119 < sVar36) * uVar119 | (ushort)((short)uVar119 >= sVar36) * sVar36) +
           auVar73._0_2_;
      auVar97._2_2_ =
           (((short)uVar125 < sVar37) * uVar125 | (ushort)((short)uVar125 >= sVar37) * sVar37) +
           auVar73._2_2_;
      auVar97._4_2_ =
           (((short)uVar126 < sVar38) * uVar126 | (ushort)((short)uVar126 >= sVar38) * sVar38) +
           auVar73._4_2_;
      auVar97._6_2_ =
           (((short)uVar127 < sVar39) * uVar127 | (ushort)((short)uVar127 >= sVar39) * sVar39) +
           auVar73._6_2_;
      auVar97._8_2_ =
           (((short)uVar128 < sVar40) * uVar128 | (ushort)((short)uVar128 >= sVar40) * sVar40) +
           auVar73._8_2_;
      auVar97._10_2_ =
           (((short)uVar129 < sVar41) * uVar129 | (ushort)((short)uVar129 >= sVar41) * sVar41) +
           auVar73._10_2_;
      auVar97._12_2_ =
           (((short)uVar130 < sVar42) * uVar130 | (ushort)((short)uVar130 >= sVar42) * sVar42) +
           auVar73._12_2_;
      auVar97._14_2_ =
           (((short)uVar131 < sVar43) * uVar131 | (ushort)((short)uVar131 >= sVar43) * sVar43) +
           auVar73._14_2_;
      auVar111 = auVar111 ^ auVar54;
      auVar97 = auVar97 ^ auVar73;
      auVar88._0_2_ = auVar87._0_2_ - uVar11;
      auVar88._2_2_ = auVar87._2_2_ - uVar12;
      auVar88._4_2_ = auVar87._4_2_ - uVar13;
      auVar88._6_2_ = auVar87._6_2_ - uVar14;
      auVar88._8_2_ = auVar87._8_2_ - uVar15;
      auVar88._10_2_ = auVar87._10_2_ - uVar16;
      auVar88._12_2_ = auVar87._12_2_ - uVar17;
      auVar88._14_2_ = auVar87._14_2_ - uVar18;
      auVar84._0_2_ = auVar83._0_2_ - uVar19;
      auVar84._2_2_ = auVar83._2_2_ - uVar20;
      auVar84._4_2_ = auVar83._4_2_ - uVar21;
      auVar84._6_2_ = auVar83._6_2_ - uVar22;
      auVar84._8_2_ = auVar83._8_2_ - uVar23;
      auVar84._10_2_ = auVar83._10_2_ - uVar24;
      auVar84._12_2_ = auVar83._12_2_ - uVar25;
      auVar84._14_2_ = auVar83._14_2_ - uVar26;
      auVar54 = pabsw(auVar120,auVar88);
      auVar87 = psraw(auVar88,0xf);
      uVar34 = (ulong)uVar29;
      uVar52 = auVar54._0_2_;
      auVar56._0_2_ = uVar52 >> uVar34;
      uVar58 = auVar54._2_2_;
      auVar56._2_2_ = uVar58 >> uVar34;
      uVar60 = auVar54._4_2_;
      auVar56._4_2_ = uVar60 >> uVar34;
      uVar62 = auVar54._6_2_;
      auVar56._6_2_ = uVar62 >> uVar34;
      uVar64 = auVar54._8_2_;
      auVar56._8_2_ = uVar64 >> uVar34;
      uVar66 = auVar54._10_2_;
      auVar56._10_2_ = uVar66 >> uVar34;
      uVar68 = auVar54._12_2_;
      uVar70 = auVar54._14_2_;
      auVar56._12_2_ = uVar68 >> uVar34;
      auVar56._14_2_ = uVar70 >> uVar34;
      auVar54 = pabsw(auVar132,auVar84);
      uVar119 = auVar54._0_2_;
      auVar137._0_2_ = uVar119 >> uVar34;
      uVar125 = auVar54._2_2_;
      auVar137._2_2_ = uVar125 >> uVar34;
      uVar126 = auVar54._4_2_;
      auVar137._4_2_ = uVar126 >> uVar34;
      uVar127 = auVar54._6_2_;
      auVar137._6_2_ = uVar127 >> uVar34;
      uVar128 = auVar54._8_2_;
      auVar137._8_2_ = uVar128 >> uVar34;
      uVar129 = auVar54._10_2_;
      auVar137._10_2_ = uVar129 >> uVar34;
      uVar130 = auVar54._12_2_;
      uVar131 = auVar54._14_2_;
      auVar137._12_2_ = uVar130 >> uVar34;
      auVar137._14_2_ = uVar131 >> uVar34;
      auVar83 = psraw(auVar84,0xf);
      auVar73 = psubusw(auVar35,auVar56);
      auVar54 = psubusw(auVar35,auVar137);
      sVar44 = auVar73._0_2_;
      sVar45 = auVar73._2_2_;
      sVar46 = auVar73._4_2_;
      sVar47 = auVar73._6_2_;
      sVar48 = auVar73._8_2_;
      sVar49 = auVar73._10_2_;
      sVar50 = auVar73._12_2_;
      sVar51 = auVar73._14_2_;
      sVar36 = auVar54._0_2_;
      sVar37 = auVar54._2_2_;
      sVar38 = auVar54._4_2_;
      sVar39 = auVar54._6_2_;
      sVar40 = auVar54._8_2_;
      sVar41 = auVar54._10_2_;
      sVar42 = auVar54._12_2_;
      sVar43 = auVar54._14_2_;
      auVar75._0_2_ =
           (((short)uVar52 < sVar44) * uVar52 | (ushort)((short)uVar52 >= sVar44) * sVar44) +
           auVar87._0_2_;
      auVar75._2_2_ =
           (((short)uVar58 < sVar45) * uVar58 | (ushort)((short)uVar58 >= sVar45) * sVar45) +
           auVar87._2_2_;
      auVar75._4_2_ =
           (((short)uVar60 < sVar46) * uVar60 | (ushort)((short)uVar60 >= sVar46) * sVar46) +
           auVar87._4_2_;
      auVar75._6_2_ =
           (((short)uVar62 < sVar47) * uVar62 | (ushort)((short)uVar62 >= sVar47) * sVar47) +
           auVar87._6_2_;
      auVar75._8_2_ =
           (((short)uVar64 < sVar48) * uVar64 | (ushort)((short)uVar64 >= sVar48) * sVar48) +
           auVar87._8_2_;
      auVar75._10_2_ =
           (((short)uVar66 < sVar49) * uVar66 | (ushort)((short)uVar66 >= sVar49) * sVar49) +
           auVar87._10_2_;
      auVar75._12_2_ =
           (((short)uVar68 < sVar50) * uVar68 | (ushort)((short)uVar68 >= sVar50) * sVar50) +
           auVar87._12_2_;
      auVar75._14_2_ =
           (((short)uVar70 < sVar51) * uVar70 | (ushort)((short)uVar70 >= sVar51) * sVar51) +
           auVar87._14_2_;
      auVar57._0_2_ =
           (((short)uVar119 < sVar36) * uVar119 | (ushort)((short)uVar119 >= sVar36) * sVar36) +
           auVar83._0_2_;
      auVar57._2_2_ =
           (((short)uVar125 < sVar37) * uVar125 | (ushort)((short)uVar125 >= sVar37) * sVar37) +
           auVar83._2_2_;
      auVar57._4_2_ =
           (((short)uVar126 < sVar38) * uVar126 | (ushort)((short)uVar126 >= sVar38) * sVar38) +
           auVar83._4_2_;
      auVar57._6_2_ =
           (((short)uVar127 < sVar39) * uVar127 | (ushort)((short)uVar127 >= sVar39) * sVar39) +
           auVar83._6_2_;
      auVar57._8_2_ =
           (((short)uVar128 < sVar40) * uVar128 | (ushort)((short)uVar128 >= sVar40) * sVar40) +
           auVar83._8_2_;
      auVar57._10_2_ =
           (((short)uVar129 < sVar41) * uVar129 | (ushort)((short)uVar129 >= sVar41) * sVar41) +
           auVar83._10_2_;
      auVar57._12_2_ =
           (((short)uVar130 < sVar42) * uVar130 | (ushort)((short)uVar130 >= sVar42) * sVar42) +
           auVar83._12_2_;
      auVar57._14_2_ =
           (((short)uVar131 < sVar43) * uVar131 | (ushort)((short)uVar131 >= sVar43) * sVar43) +
           auVar83._14_2_;
      auVar75 = auVar75 ^ auVar87;
      auVar57 = auVar57 ^ auVar83;
      auVar54 = pshuflw(ZEXT416((uint)cdef_pri_taps[bVar32][0]),
                        ZEXT416((uint)cdef_pri_taps[bVar32][0]),0);
      auVar85._0_4_ = auVar54._0_4_;
      auVar85._4_4_ = auVar85._0_4_;
      auVar85._8_4_ = auVar85._0_4_;
      auVar85._12_4_ = auVar85._0_4_;
      sVar36 = auVar54._0_2_;
      sVar38 = auVar54._2_2_;
      auVar83 = lddqu(auVar97,*(undefined1 (*) [16])(in + lVar28));
      auVar96 = lddqu(auVar111,*(undefined1 (*) [16])(in + lVar28 + 0x90));
      auVar73 = lddqu(auVar87,*(undefined1 (*) [16])(in + -lVar28));
      auVar54 = lddqu(auVar85,*(undefined1 (*) [16])(in + (0x90 - lVar28)));
      auVar98._0_2_ = auVar83._0_2_ - uVar11;
      auVar98._2_2_ = auVar83._2_2_ - uVar12;
      auVar98._4_2_ = auVar83._4_2_ - uVar13;
      auVar98._6_2_ = auVar83._6_2_ - uVar14;
      auVar98._8_2_ = auVar83._8_2_ - uVar15;
      auVar98._10_2_ = auVar83._10_2_ - uVar16;
      auVar98._12_2_ = auVar83._12_2_ - uVar17;
      auVar98._14_2_ = auVar83._14_2_ - uVar18;
      auVar112._0_2_ = auVar96._0_2_ - uVar19;
      auVar112._2_2_ = auVar96._2_2_ - uVar20;
      auVar112._4_2_ = auVar96._4_2_ - uVar21;
      auVar112._6_2_ = auVar96._6_2_ - uVar22;
      auVar112._8_2_ = auVar96._8_2_ - uVar23;
      auVar112._10_2_ = auVar96._10_2_ - uVar24;
      auVar112._12_2_ = auVar96._12_2_ - uVar25;
      auVar112._14_2_ = auVar96._14_2_ - uVar26;
      auVar120 = pabsw(auVar137,auVar98);
      auVar83 = psraw(auVar98,0xf);
      auVar132 = pabsw(in_XMM14,auVar112);
      auVar87 = psraw(auVar112,0xf);
      uVar52 = auVar120._0_2_;
      auVar121._0_2_ = uVar52 >> uVar34;
      uVar58 = auVar120._2_2_;
      auVar121._2_2_ = uVar58 >> uVar34;
      uVar60 = auVar120._4_2_;
      auVar121._4_2_ = uVar60 >> uVar34;
      uVar62 = auVar120._6_2_;
      auVar121._6_2_ = uVar62 >> uVar34;
      uVar64 = auVar120._8_2_;
      auVar121._8_2_ = uVar64 >> uVar34;
      uVar66 = auVar120._10_2_;
      auVar121._10_2_ = uVar66 >> uVar34;
      uVar68 = auVar120._12_2_;
      uVar70 = auVar120._14_2_;
      auVar121._12_2_ = uVar68 >> uVar34;
      auVar121._14_2_ = uVar70 >> uVar34;
      uVar119 = auVar132._0_2_;
      auVar140._0_2_ = uVar119 >> uVar34;
      uVar125 = auVar132._2_2_;
      auVar140._2_2_ = uVar125 >> uVar34;
      uVar126 = auVar132._4_2_;
      auVar140._4_2_ = uVar126 >> uVar34;
      uVar127 = auVar132._6_2_;
      auVar140._6_2_ = uVar127 >> uVar34;
      uVar128 = auVar132._8_2_;
      auVar140._8_2_ = uVar128 >> uVar34;
      uVar129 = auVar132._10_2_;
      auVar140._10_2_ = uVar129 >> uVar34;
      uVar130 = auVar132._12_2_;
      uVar131 = auVar132._14_2_;
      auVar140._12_2_ = uVar130 >> uVar34;
      auVar140._14_2_ = uVar131 >> uVar34;
      auVar110 = psubusw(auVar35,auVar121);
      auVar96 = psubusw(auVar35,auVar140);
      sVar46 = auVar110._0_2_;
      sVar47 = auVar110._2_2_;
      sVar48 = auVar110._4_2_;
      sVar49 = auVar110._6_2_;
      sVar50 = auVar110._8_2_;
      sVar51 = auVar110._10_2_;
      sVar53 = auVar110._12_2_;
      sVar59 = auVar110._14_2_;
      sVar37 = auVar96._0_2_;
      sVar39 = auVar96._2_2_;
      sVar40 = auVar96._4_2_;
      sVar41 = auVar96._6_2_;
      sVar42 = auVar96._8_2_;
      sVar43 = auVar96._10_2_;
      sVar44 = auVar96._12_2_;
      sVar45 = auVar96._14_2_;
      auVar133._0_2_ =
           (((short)uVar52 < sVar46) * uVar52 | (ushort)((short)uVar52 >= sVar46) * sVar46) +
           auVar83._0_2_;
      auVar133._2_2_ =
           (((short)uVar58 < sVar47) * uVar58 | (ushort)((short)uVar58 >= sVar47) * sVar47) +
           auVar83._2_2_;
      auVar133._4_2_ =
           (((short)uVar60 < sVar48) * uVar60 | (ushort)((short)uVar60 >= sVar48) * sVar48) +
           auVar83._4_2_;
      auVar133._6_2_ =
           (((short)uVar62 < sVar49) * uVar62 | (ushort)((short)uVar62 >= sVar49) * sVar49) +
           auVar83._6_2_;
      auVar133._8_2_ =
           (((short)uVar64 < sVar50) * uVar64 | (ushort)((short)uVar64 >= sVar50) * sVar50) +
           auVar83._8_2_;
      auVar133._10_2_ =
           (((short)uVar66 < sVar51) * uVar66 | (ushort)((short)uVar66 >= sVar51) * sVar51) +
           auVar83._10_2_;
      auVar133._12_2_ =
           (((short)uVar68 < sVar53) * uVar68 | (ushort)((short)uVar68 >= sVar53) * sVar53) +
           auVar83._12_2_;
      auVar133._14_2_ =
           (((short)uVar70 < sVar59) * uVar70 | (ushort)((short)uVar70 >= sVar59) * sVar59) +
           auVar83._14_2_;
      auVar122._0_2_ =
           (((short)uVar119 < sVar37) * uVar119 | (ushort)((short)uVar119 >= sVar37) * sVar37) +
           auVar87._0_2_;
      auVar122._2_2_ =
           (((short)uVar125 < sVar39) * uVar125 | (ushort)((short)uVar125 >= sVar39) * sVar39) +
           auVar87._2_2_;
      auVar122._4_2_ =
           (((short)uVar126 < sVar40) * uVar126 | (ushort)((short)uVar126 >= sVar40) * sVar40) +
           auVar87._4_2_;
      auVar122._6_2_ =
           (((short)uVar127 < sVar41) * uVar127 | (ushort)((short)uVar127 >= sVar41) * sVar41) +
           auVar87._6_2_;
      auVar122._8_2_ =
           (((short)uVar128 < sVar42) * uVar128 | (ushort)((short)uVar128 >= sVar42) * sVar42) +
           auVar87._8_2_;
      auVar122._10_2_ =
           (((short)uVar129 < sVar43) * uVar129 | (ushort)((short)uVar129 >= sVar43) * sVar43) +
           auVar87._10_2_;
      auVar122._12_2_ =
           (((short)uVar130 < sVar44) * uVar130 | (ushort)((short)uVar130 >= sVar44) * sVar44) +
           auVar87._12_2_;
      auVar122._14_2_ =
           (((short)uVar131 < sVar45) * uVar131 | (ushort)((short)uVar131 >= sVar45) * sVar45) +
           auVar87._14_2_;
      in_XMM12 = auVar133 ^ auVar83;
      in_XMM11 = auVar122 ^ auVar87;
      auVar89._0_2_ = auVar73._0_2_ - uVar11;
      auVar89._2_2_ = auVar73._2_2_ - uVar12;
      auVar89._4_2_ = auVar73._4_2_ - uVar13;
      auVar89._6_2_ = auVar73._6_2_ - uVar14;
      auVar89._8_2_ = auVar73._8_2_ - uVar15;
      auVar89._10_2_ = auVar73._10_2_ - uVar16;
      auVar89._12_2_ = auVar73._12_2_ - uVar17;
      auVar89._14_2_ = auVar73._14_2_ - uVar18;
      auVar86._0_2_ = auVar54._0_2_ - uVar19;
      auVar86._2_2_ = auVar54._2_2_ - uVar20;
      auVar86._4_2_ = auVar54._4_2_ - uVar21;
      auVar86._6_2_ = auVar54._6_2_ - uVar22;
      auVar86._8_2_ = auVar54._8_2_ - uVar23;
      auVar86._10_2_ = auVar54._10_2_ - uVar24;
      auVar86._12_2_ = auVar54._12_2_ - uVar25;
      auVar86._14_2_ = auVar54._14_2_ - uVar26;
      auVar54 = pabsw(auVar120,auVar89);
      in_XMM8 = psraw(auVar89,0xf);
      in_XMM14 = pabsw(auVar132,auVar86);
      uVar34 = (ulong)uVar29;
      uVar52 = auVar54._0_2_;
      auVar113._0_2_ = uVar52 >> uVar34;
      uVar58 = auVar54._2_2_;
      auVar113._2_2_ = uVar58 >> uVar34;
      uVar60 = auVar54._4_2_;
      auVar113._4_2_ = uVar60 >> uVar34;
      uVar62 = auVar54._6_2_;
      auVar113._6_2_ = uVar62 >> uVar34;
      uVar64 = auVar54._8_2_;
      auVar113._8_2_ = uVar64 >> uVar34;
      uVar66 = auVar54._10_2_;
      auVar113._10_2_ = uVar66 >> uVar34;
      uVar68 = auVar54._12_2_;
      uVar70 = auVar54._14_2_;
      auVar113._12_2_ = uVar68 >> uVar34;
      auVar113._14_2_ = uVar70 >> uVar34;
      auVar54 = psraw(auVar86,0xf);
      uVar119 = in_XMM14._0_2_;
      auVar141._0_2_ = uVar119 >> uVar34;
      uVar125 = in_XMM14._2_2_;
      auVar141._2_2_ = uVar125 >> uVar34;
      uVar126 = in_XMM14._4_2_;
      auVar141._4_2_ = uVar126 >> uVar34;
      uVar127 = in_XMM14._6_2_;
      auVar141._6_2_ = uVar127 >> uVar34;
      uVar128 = in_XMM14._8_2_;
      auVar141._8_2_ = uVar128 >> uVar34;
      uVar129 = in_XMM14._10_2_;
      auVar141._10_2_ = uVar129 >> uVar34;
      uVar130 = in_XMM14._12_2_;
      uVar131 = in_XMM14._14_2_;
      auVar141._12_2_ = uVar130 >> uVar34;
      auVar141._14_2_ = uVar131 >> uVar34;
      auVar73 = psubusw(auVar35,auVar113);
      auVar83 = psubusw(auVar35,auVar141);
      sVar37 = auVar73._0_2_;
      sVar39 = auVar73._2_2_;
      sVar40 = auVar73._4_2_;
      sVar41 = auVar73._6_2_;
      sVar42 = auVar73._8_2_;
      sVar43 = auVar73._10_2_;
      sVar44 = auVar73._12_2_;
      sVar45 = auVar73._14_2_;
      sVar46 = auVar83._0_2_;
      sVar47 = auVar83._2_2_;
      sVar48 = auVar83._4_2_;
      sVar49 = auVar83._6_2_;
      sVar50 = auVar83._8_2_;
      sVar51 = auVar83._10_2_;
      sVar53 = auVar83._12_2_;
      sVar59 = auVar83._14_2_;
      auVar99._0_2_ =
           (((short)uVar52 < sVar37) * uVar52 | (ushort)((short)uVar52 >= sVar37) * sVar37) +
           in_XMM8._0_2_;
      auVar99._2_2_ =
           (((short)uVar58 < sVar39) * uVar58 | (ushort)((short)uVar58 >= sVar39) * sVar39) +
           in_XMM8._2_2_;
      auVar99._4_2_ =
           (((short)uVar60 < sVar40) * uVar60 | (ushort)((short)uVar60 >= sVar40) * sVar40) +
           in_XMM8._4_2_;
      auVar99._6_2_ =
           (((short)uVar62 < sVar41) * uVar62 | (ushort)((short)uVar62 >= sVar41) * sVar41) +
           in_XMM8._6_2_;
      auVar99._8_2_ =
           (((short)uVar64 < sVar42) * uVar64 | (ushort)((short)uVar64 >= sVar42) * sVar42) +
           in_XMM8._8_2_;
      auVar99._10_2_ =
           (((short)uVar66 < sVar43) * uVar66 | (ushort)((short)uVar66 >= sVar43) * sVar43) +
           in_XMM8._10_2_;
      auVar99._12_2_ =
           (((short)uVar68 < sVar44) * uVar68 | (ushort)((short)uVar68 >= sVar44) * sVar44) +
           in_XMM8._12_2_;
      auVar99._14_2_ =
           (((short)uVar70 < sVar45) * uVar70 | (ushort)((short)uVar70 >= sVar45) * sVar45) +
           in_XMM8._14_2_;
      auVar114._0_2_ =
           (((short)uVar119 < sVar46) * uVar119 | (ushort)((short)uVar119 >= sVar46) * sVar46) +
           auVar54._0_2_;
      auVar114._2_2_ =
           (((short)uVar125 < sVar47) * uVar125 | (ushort)((short)uVar125 >= sVar47) * sVar47) +
           auVar54._2_2_;
      auVar114._4_2_ =
           (((short)uVar126 < sVar48) * uVar126 | (ushort)((short)uVar126 >= sVar48) * sVar48) +
           auVar54._4_2_;
      auVar114._6_2_ =
           (((short)uVar127 < sVar49) * uVar127 | (ushort)((short)uVar127 >= sVar49) * sVar49) +
           auVar54._6_2_;
      auVar114._8_2_ =
           (((short)uVar128 < sVar50) * uVar128 | (ushort)((short)uVar128 >= sVar50) * sVar50) +
           auVar54._8_2_;
      auVar114._10_2_ =
           (((short)uVar129 < sVar51) * uVar129 | (ushort)((short)uVar129 >= sVar51) * sVar51) +
           auVar54._10_2_;
      auVar114._12_2_ =
           (((short)uVar130 < sVar53) * uVar130 | (ushort)((short)uVar130 >= sVar53) * sVar53) +
           auVar54._12_2_;
      auVar114._14_2_ =
           (((short)uVar131 < sVar59) * uVar131 | (ushort)((short)uVar131 >= sVar59) * sVar59) +
           auVar54._14_2_;
      auVar99 = auVar99 ^ in_XMM8;
      auVar114 = auVar114 ^ auVar54;
      auVar54 = pshuflw(ZEXT416((uint)cdef_pri_taps[bVar32][1]),
                        ZEXT416((uint)cdef_pri_taps[bVar32][1]),0);
      in_XMM7._0_4_ = auVar54._0_4_;
      in_XMM7._4_4_ = in_XMM7._0_4_;
      in_XMM7._8_4_ = in_XMM7._0_4_;
      in_XMM7._12_4_ = in_XMM7._0_4_;
      sVar37 = auVar54._0_2_;
      sVar39 = auVar54._2_2_;
      auVar100._0_2_ =
           (auVar99._0_2_ + in_XMM12._0_2_) * sVar37 + (auVar75._0_2_ + auVar111._0_2_) * sVar36;
      auVar100._2_2_ =
           (auVar99._2_2_ + in_XMM12._2_2_) * sVar39 + (auVar75._2_2_ + auVar111._2_2_) * sVar38;
      auVar100._4_2_ =
           (auVar99._4_2_ + in_XMM12._4_2_) * sVar37 + (auVar75._4_2_ + auVar111._4_2_) * sVar36;
      auVar100._6_2_ =
           (auVar99._6_2_ + in_XMM12._6_2_) * sVar39 + (auVar75._6_2_ + auVar111._6_2_) * sVar38;
      auVar100._8_2_ =
           (auVar99._8_2_ + in_XMM12._8_2_) * sVar37 + (auVar75._8_2_ + auVar111._8_2_) * sVar36;
      auVar100._10_2_ =
           (auVar99._10_2_ + in_XMM12._10_2_) * sVar39 + (auVar75._10_2_ + auVar111._10_2_) * sVar38
      ;
      auVar100._12_2_ =
           (auVar99._12_2_ + in_XMM12._12_2_) * sVar37 + (auVar75._12_2_ + auVar111._12_2_) * sVar36
      ;
      auVar100._14_2_ =
           (auVar99._14_2_ + in_XMM12._14_2_) * sVar39 + (auVar75._14_2_ + auVar111._14_2_) * sVar38
      ;
      auVar115._0_2_ =
           (auVar114._0_2_ + in_XMM11._0_2_) * sVar37 + (auVar57._0_2_ + auVar97._0_2_) * sVar36;
      auVar115._2_2_ =
           (auVar114._2_2_ + in_XMM11._2_2_) * sVar39 + (auVar57._2_2_ + auVar97._2_2_) * sVar38;
      auVar115._4_2_ =
           (auVar114._4_2_ + in_XMM11._4_2_) * sVar37 + (auVar57._4_2_ + auVar97._4_2_) * sVar36;
      auVar115._6_2_ =
           (auVar114._6_2_ + in_XMM11._6_2_) * sVar39 + (auVar57._6_2_ + auVar97._6_2_) * sVar38;
      auVar115._8_2_ =
           (auVar114._8_2_ + in_XMM11._8_2_) * sVar37 + (auVar57._8_2_ + auVar97._8_2_) * sVar36;
      auVar115._10_2_ =
           (auVar114._10_2_ + in_XMM11._10_2_) * sVar39 + (auVar57._10_2_ + auVar97._10_2_) * sVar38
      ;
      auVar115._12_2_ =
           (auVar114._12_2_ + in_XMM11._12_2_) * sVar37 + (auVar57._12_2_ + auVar97._12_2_) * sVar36
      ;
      auVar115._14_2_ =
           (auVar114._14_2_ + in_XMM11._14_2_) * sVar39 + (auVar57._14_2_ + auVar97._14_2_) * sVar38
      ;
      in_XMM5 = psraw(auVar100,0xf);
      in_XMM6 = psraw(auVar115,0xf);
      auVar101._0_2_ = auVar100._0_2_ + auVar33._0_2_ + in_XMM5._0_2_;
      auVar101._2_2_ = auVar100._2_2_ + auVar33._2_2_ + in_XMM5._2_2_;
      auVar101._4_2_ = auVar100._4_2_ + auVar33._4_2_ + in_XMM5._4_2_;
      auVar101._6_2_ = auVar100._6_2_ + auVar33._6_2_ + in_XMM5._6_2_;
      auVar101._8_2_ = auVar100._8_2_ + auVar33._8_2_ + in_XMM5._8_2_;
      auVar101._10_2_ = auVar100._10_2_ + auVar33._10_2_ + in_XMM5._10_2_;
      auVar101._12_2_ = auVar100._12_2_ + auVar33._12_2_ + in_XMM5._12_2_;
      auVar101._14_2_ = auVar100._14_2_ + auVar33._14_2_ + in_XMM5._14_2_;
      auVar116._0_2_ = auVar115._0_2_ + auVar33._0_2_ + in_XMM6._0_2_;
      auVar116._2_2_ = auVar115._2_2_ + auVar33._2_2_ + in_XMM6._2_2_;
      auVar116._4_2_ = auVar115._4_2_ + auVar33._4_2_ + in_XMM6._4_2_;
      auVar116._6_2_ = auVar115._6_2_ + auVar33._6_2_ + in_XMM6._6_2_;
      auVar116._8_2_ = auVar115._8_2_ + auVar33._8_2_ + in_XMM6._8_2_;
      auVar116._10_2_ = auVar115._10_2_ + auVar33._10_2_ + in_XMM6._10_2_;
      auVar116._12_2_ = auVar115._12_2_ + auVar33._12_2_ + in_XMM6._12_2_;
      auVar116._14_2_ = auVar115._14_2_ + auVar33._14_2_ + in_XMM6._14_2_;
      auVar54 = psraw(auVar101,4);
      auVar73 = psraw(auVar116,4);
      *(uint16_t *)dest = auVar54._0_2_ + uVar11;
      *(uint16_t *)((long)dest + 2) = auVar54._2_2_ + uVar12;
      *(uint16_t *)((long)dest + 4) = auVar54._4_2_ + uVar13;
      *(uint16_t *)((long)dest + 6) = auVar54._6_2_ + uVar14;
      *(uint16_t *)((long)dest + 8) = auVar54._8_2_ + uVar15;
      *(uint16_t *)((long)dest + 10) = auVar54._10_2_ + uVar16;
      *(uint16_t *)((long)dest + 0xc) = auVar54._12_2_ + uVar17;
      *(uint16_t *)((long)dest + 0xe) = auVar54._14_2_ + uVar18;
      psVar1 = (short *)((long)dest + (long)dstride * 2);
      *psVar1 = auVar73._0_2_ + uVar19;
      psVar1[1] = auVar73._2_2_ + uVar20;
      psVar1[2] = auVar73._4_2_ + uVar21;
      psVar1[3] = auVar73._6_2_ + uVar22;
      psVar1[4] = auVar73._8_2_ + uVar23;
      psVar1[5] = auVar73._10_2_ + uVar24;
      psVar1[6] = auVar73._12_2_ + uVar25;
      psVar1[7] = auVar73._14_2_ + uVar26;
      dest = (void *)((long)dest + (long)dstride * 2 * 2);
      in = in + 0x120;
    }
  }
  else {
    uVar29 = pri_damping;
    if (pri_strength != 0) {
      iVar10 = 0x1f;
      if (pri_strength != 0) {
        for (; (uint)pri_strength >> iVar10 == 0; iVar10 = iVar10 + -1) {
        }
      }
      uVar29 = pri_damping - iVar10;
      if (pri_damping < iVar10) {
        uVar29 = 0;
      }
    }
    auVar33 = pshuflw(ZEXT416((uint)pri_strength),ZEXT416((uint)pri_strength),0);
    auVar33._4_4_ = auVar33._0_4_;
    auVar33._8_4_ = auVar33._0_4_;
    auVar33._12_4_ = auVar33._0_4_;
    lVar30 = (long)dstride;
    lVar31 = 0;
    auVar35 = pmovsxbw(in_XMM2,0x808080808080808);
    for (; lVar31 < block_height; lVar31 = lVar31 + 4) {
      uVar2 = *(undefined8 *)in;
      uVar3 = *(undefined8 *)(in + 0x90);
      uVar4 = *(undefined8 *)(in + 0x120);
      uVar5 = *(undefined8 *)(in + 0x1b0);
      uVar6 = *(undefined8 *)(in + lVar27);
      uVar7 = *(undefined8 *)(in + lVar27 + 0x90);
      uVar8 = *(undefined8 *)(in + lVar27 + 0x120);
      uVar9 = *(undefined8 *)(in + lVar27 + 0x1b0);
      sVar44 = (short)uVar3;
      auVar54._0_2_ = (short)uVar7 - sVar44;
      sVar45 = (short)((ulong)uVar3 >> 0x10);
      auVar54._2_2_ = (short)((ulong)uVar7 >> 0x10) - sVar45;
      sVar46 = (short)((ulong)uVar3 >> 0x20);
      auVar54._4_2_ = (short)((ulong)uVar7 >> 0x20) - sVar46;
      sVar47 = (short)((ulong)uVar3 >> 0x30);
      auVar54._6_2_ = (short)((ulong)uVar7 >> 0x30) - sVar47;
      sVar48 = (short)uVar2;
      auVar54._8_2_ = (short)uVar6 - sVar48;
      sVar49 = (short)((ulong)uVar2 >> 0x10);
      auVar54._10_2_ = (short)((ulong)uVar6 >> 0x10) - sVar49;
      sVar50 = (short)((ulong)uVar2 >> 0x20);
      auVar54._12_2_ = (short)((ulong)uVar6 >> 0x20) - sVar50;
      sVar51 = (short)((ulong)uVar2 >> 0x30);
      auVar54._14_2_ = (short)((ulong)uVar6 >> 0x30) - sVar51;
      sVar36 = (short)uVar5;
      auVar87._0_2_ = (short)uVar9 - sVar36;
      sVar37 = (short)((ulong)uVar5 >> 0x10);
      auVar87._2_2_ = (short)((ulong)uVar9 >> 0x10) - sVar37;
      sVar38 = (short)((ulong)uVar5 >> 0x20);
      auVar87._4_2_ = (short)((ulong)uVar9 >> 0x20) - sVar38;
      sVar39 = (short)((ulong)uVar5 >> 0x30);
      auVar87._6_2_ = (short)((ulong)uVar9 >> 0x30) - sVar39;
      sVar40 = (short)uVar4;
      auVar87._8_2_ = (short)uVar8 - sVar40;
      sVar41 = (short)((ulong)uVar4 >> 0x10);
      auVar87._10_2_ = (short)((ulong)uVar8 >> 0x10) - sVar41;
      sVar42 = (short)((ulong)uVar4 >> 0x20);
      auVar87._12_2_ = (short)((ulong)uVar8 >> 0x20) - sVar42;
      sVar43 = (short)((ulong)uVar4 >> 0x30);
      auVar87._14_2_ = (short)((ulong)uVar8 >> 0x30) - sVar43;
      auVar73 = pabsw(in_XMM9,auVar54);
      auVar54 = psraw(auVar54,0xf);
      uVar34 = (ulong)uVar29;
      uVar52 = auVar73._0_2_;
      auVar110._0_2_ = uVar52 >> uVar34;
      uVar58 = auVar73._2_2_;
      auVar110._2_2_ = uVar58 >> uVar34;
      uVar60 = auVar73._4_2_;
      auVar110._4_2_ = uVar60 >> uVar34;
      uVar62 = auVar73._6_2_;
      auVar110._6_2_ = uVar62 >> uVar34;
      uVar64 = auVar73._8_2_;
      auVar110._8_2_ = uVar64 >> uVar34;
      uVar66 = auVar73._10_2_;
      auVar110._10_2_ = uVar66 >> uVar34;
      uVar68 = auVar73._12_2_;
      uVar70 = auVar73._14_2_;
      auVar110._12_2_ = uVar68 >> uVar34;
      auVar110._14_2_ = uVar70 >> uVar34;
      auVar73 = pabsw(in_XMM10,auVar87);
      uVar119 = auVar73._0_2_;
      auVar123._0_2_ = uVar119 >> uVar34;
      uVar125 = auVar73._2_2_;
      auVar123._2_2_ = uVar125 >> uVar34;
      uVar126 = auVar73._4_2_;
      auVar123._4_2_ = uVar126 >> uVar34;
      uVar127 = auVar73._6_2_;
      auVar123._6_2_ = uVar127 >> uVar34;
      uVar128 = auVar73._8_2_;
      auVar123._8_2_ = uVar128 >> uVar34;
      uVar129 = auVar73._10_2_;
      auVar123._10_2_ = uVar129 >> uVar34;
      uVar130 = auVar73._12_2_;
      uVar131 = auVar73._14_2_;
      auVar123._12_2_ = uVar130 >> uVar34;
      auVar123._14_2_ = uVar131 >> uVar34;
      auVar73 = psraw(auVar87,0xf);
      auVar87 = psubusw(auVar33,auVar110);
      auVar83 = psubusw(auVar33,auVar123);
      sVar72 = auVar87._0_2_;
      sVar76 = auVar87._2_2_;
      sVar77 = auVar87._4_2_;
      sVar78 = auVar87._6_2_;
      sVar79 = auVar87._8_2_;
      sVar80 = auVar87._10_2_;
      sVar81 = auVar87._12_2_;
      sVar82 = auVar87._14_2_;
      sVar53 = auVar83._0_2_;
      sVar59 = auVar83._2_2_;
      sVar61 = auVar83._4_2_;
      sVar63 = auVar83._6_2_;
      sVar65 = auVar83._8_2_;
      sVar67 = auVar83._10_2_;
      sVar69 = auVar83._12_2_;
      sVar71 = auVar83._14_2_;
      auVar90._0_2_ =
           (((short)uVar52 < sVar72) * uVar52 | (ushort)((short)uVar52 >= sVar72) * sVar72) +
           auVar54._0_2_;
      auVar90._2_2_ =
           (((short)uVar58 < sVar76) * uVar58 | (ushort)((short)uVar58 >= sVar76) * sVar76) +
           auVar54._2_2_;
      auVar90._4_2_ =
           (((short)uVar60 < sVar77) * uVar60 | (ushort)((short)uVar60 >= sVar77) * sVar77) +
           auVar54._4_2_;
      auVar90._6_2_ =
           (((short)uVar62 < sVar78) * uVar62 | (ushort)((short)uVar62 >= sVar78) * sVar78) +
           auVar54._6_2_;
      auVar90._8_2_ =
           (((short)uVar64 < sVar79) * uVar64 | (ushort)((short)uVar64 >= sVar79) * sVar79) +
           auVar54._8_2_;
      auVar90._10_2_ =
           (((short)uVar66 < sVar80) * uVar66 | (ushort)((short)uVar66 >= sVar80) * sVar80) +
           auVar54._10_2_;
      auVar90._12_2_ =
           (((short)uVar68 < sVar81) * uVar68 | (ushort)((short)uVar68 >= sVar81) * sVar81) +
           auVar54._12_2_;
      auVar90._14_2_ =
           (((short)uVar70 < sVar82) * uVar70 | (ushort)((short)uVar70 >= sVar82) * sVar82) +
           auVar54._14_2_;
      auVar120._0_2_ =
           (((short)uVar119 < sVar53) * uVar119 | (ushort)((short)uVar119 >= sVar53) * sVar53) +
           auVar73._0_2_;
      auVar120._2_2_ =
           (((short)uVar125 < sVar59) * uVar125 | (ushort)((short)uVar125 >= sVar59) * sVar59) +
           auVar73._2_2_;
      auVar120._4_2_ =
           (((short)uVar126 < sVar61) * uVar126 | (ushort)((short)uVar126 >= sVar61) * sVar61) +
           auVar73._4_2_;
      auVar120._6_2_ =
           (((short)uVar127 < sVar63) * uVar127 | (ushort)((short)uVar127 >= sVar63) * sVar63) +
           auVar73._6_2_;
      auVar120._8_2_ =
           (((short)uVar128 < sVar65) * uVar128 | (ushort)((short)uVar128 >= sVar65) * sVar65) +
           auVar73._8_2_;
      auVar120._10_2_ =
           (((short)uVar129 < sVar67) * uVar129 | (ushort)((short)uVar129 >= sVar67) * sVar67) +
           auVar73._10_2_;
      auVar120._12_2_ =
           (((short)uVar130 < sVar69) * uVar130 | (ushort)((short)uVar130 >= sVar69) * sVar69) +
           auVar73._12_2_;
      auVar120._14_2_ =
           (((short)uVar131 < sVar71) * uVar131 | (ushort)((short)uVar131 >= sVar71) * sVar71) +
           auVar73._14_2_;
      auVar90 = auVar90 ^ auVar54;
      auVar120 = auVar120 ^ auVar73;
      uVar2 = *(undefined8 *)(in + -lVar27);
      uVar3 = *(undefined8 *)(in + (0x90 - lVar27));
      uVar4 = *(undefined8 *)(in + (0x120 - lVar27));
      uVar5 = *(undefined8 *)(in + (0x1b0 - lVar27));
      auVar102._0_2_ = (short)uVar3 - sVar44;
      auVar102._2_2_ = (short)((ulong)uVar3 >> 0x10) - sVar45;
      auVar102._4_2_ = (short)((ulong)uVar3 >> 0x20) - sVar46;
      auVar102._6_2_ = (short)((ulong)uVar3 >> 0x30) - sVar47;
      auVar102._8_2_ = (short)uVar2 - sVar48;
      auVar102._10_2_ = (short)((ulong)uVar2 >> 0x10) - sVar49;
      auVar102._12_2_ = (short)((ulong)uVar2 >> 0x20) - sVar50;
      auVar102._14_2_ = (short)((ulong)uVar2 >> 0x30) - sVar51;
      auVar117._0_2_ = (short)uVar5 - sVar36;
      auVar117._2_2_ = (short)((ulong)uVar5 >> 0x10) - sVar37;
      auVar117._4_2_ = (short)((ulong)uVar5 >> 0x20) - sVar38;
      auVar117._6_2_ = (short)((ulong)uVar5 >> 0x30) - sVar39;
      auVar117._8_2_ = (short)uVar4 - sVar40;
      auVar117._10_2_ = (short)((ulong)uVar4 >> 0x10) - sVar41;
      auVar117._12_2_ = (short)((ulong)uVar4 >> 0x20) - sVar42;
      auVar117._14_2_ = (short)((ulong)uVar4 >> 0x30) - sVar43;
      auVar132 = pabsw(auVar123,auVar102);
      auVar87 = psraw(auVar102,0xf);
      uVar34 = (ulong)uVar29;
      uVar52 = auVar132._0_2_;
      auVar73._0_2_ = uVar52 >> uVar34;
      uVar58 = auVar132._2_2_;
      auVar73._2_2_ = uVar58 >> uVar34;
      uVar60 = auVar132._4_2_;
      auVar73._4_2_ = uVar60 >> uVar34;
      uVar62 = auVar132._6_2_;
      auVar73._6_2_ = uVar62 >> uVar34;
      uVar64 = auVar132._8_2_;
      auVar73._8_2_ = uVar64 >> uVar34;
      uVar66 = auVar132._10_2_;
      auVar73._10_2_ = uVar66 >> uVar34;
      uVar68 = auVar132._12_2_;
      uVar70 = auVar132._14_2_;
      auVar73._12_2_ = uVar68 >> uVar34;
      auVar73._14_2_ = uVar70 >> uVar34;
      auVar134 = pabsw(in_XMM12,auVar117);
      uVar119 = auVar134._0_2_;
      auVar138._0_2_ = uVar119 >> uVar34;
      uVar125 = auVar134._2_2_;
      auVar138._2_2_ = uVar125 >> uVar34;
      uVar126 = auVar134._4_2_;
      auVar138._4_2_ = uVar126 >> uVar34;
      uVar127 = auVar134._6_2_;
      auVar138._6_2_ = uVar127 >> uVar34;
      uVar128 = auVar134._8_2_;
      auVar138._8_2_ = uVar128 >> uVar34;
      uVar129 = auVar134._10_2_;
      auVar138._10_2_ = uVar129 >> uVar34;
      uVar130 = auVar134._12_2_;
      uVar131 = auVar134._14_2_;
      auVar138._12_2_ = uVar130 >> uVar34;
      auVar138._14_2_ = uVar131 >> uVar34;
      auVar110 = psraw(auVar117,0xf);
      auVar73 = psubusw(auVar33,auVar73);
      auVar54 = psubusw(auVar33,auVar138);
      sVar72 = auVar73._0_2_;
      sVar76 = auVar73._2_2_;
      sVar77 = auVar73._4_2_;
      sVar78 = auVar73._6_2_;
      sVar79 = auVar73._8_2_;
      sVar80 = auVar73._10_2_;
      sVar81 = auVar73._12_2_;
      sVar82 = auVar73._14_2_;
      sVar53 = auVar54._0_2_;
      sVar59 = auVar54._2_2_;
      sVar61 = auVar54._4_2_;
      sVar63 = auVar54._6_2_;
      sVar65 = auVar54._8_2_;
      sVar67 = auVar54._10_2_;
      sVar69 = auVar54._12_2_;
      sVar71 = auVar54._14_2_;
      auVar96._0_2_ =
           (((short)uVar52 < sVar72) * uVar52 | (ushort)((short)uVar52 >= sVar72) * sVar72) +
           auVar87._0_2_;
      auVar96._2_2_ =
           (((short)uVar58 < sVar76) * uVar58 | (ushort)((short)uVar58 >= sVar76) * sVar76) +
           auVar87._2_2_;
      auVar96._4_2_ =
           (((short)uVar60 < sVar77) * uVar60 | (ushort)((short)uVar60 >= sVar77) * sVar77) +
           auVar87._4_2_;
      auVar96._6_2_ =
           (((short)uVar62 < sVar78) * uVar62 | (ushort)((short)uVar62 >= sVar78) * sVar78) +
           auVar87._6_2_;
      auVar96._8_2_ =
           (((short)uVar64 < sVar79) * uVar64 | (ushort)((short)uVar64 >= sVar79) * sVar79) +
           auVar87._8_2_;
      auVar96._10_2_ =
           (((short)uVar66 < sVar80) * uVar66 | (ushort)((short)uVar66 >= sVar80) * sVar80) +
           auVar87._10_2_;
      auVar96._12_2_ =
           (((short)uVar68 < sVar81) * uVar68 | (ushort)((short)uVar68 >= sVar81) * sVar81) +
           auVar87._12_2_;
      auVar96._14_2_ =
           (((short)uVar70 < sVar82) * uVar70 | (ushort)((short)uVar70 >= sVar82) * sVar82) +
           auVar87._14_2_;
      auVar83._0_2_ =
           (((short)uVar119 < sVar53) * uVar119 | (ushort)((short)uVar119 >= sVar53) * sVar53) +
           auVar110._0_2_;
      auVar83._2_2_ =
           (((short)uVar125 < sVar59) * uVar125 | (ushort)((short)uVar125 >= sVar59) * sVar59) +
           auVar110._2_2_;
      auVar83._4_2_ =
           (((short)uVar126 < sVar61) * uVar126 | (ushort)((short)uVar126 >= sVar61) * sVar61) +
           auVar110._4_2_;
      auVar83._6_2_ =
           (((short)uVar127 < sVar63) * uVar127 | (ushort)((short)uVar127 >= sVar63) * sVar63) +
           auVar110._6_2_;
      auVar83._8_2_ =
           (((short)uVar128 < sVar65) * uVar128 | (ushort)((short)uVar128 >= sVar65) * sVar65) +
           auVar110._8_2_;
      auVar83._10_2_ =
           (((short)uVar129 < sVar67) * uVar129 | (ushort)((short)uVar129 >= sVar67) * sVar67) +
           auVar110._10_2_;
      auVar83._12_2_ =
           (((short)uVar130 < sVar69) * uVar130 | (ushort)((short)uVar130 >= sVar69) * sVar69) +
           auVar110._12_2_;
      auVar83._14_2_ =
           (((short)uVar131 < sVar71) * uVar131 | (ushort)((short)uVar131 >= sVar71) * sVar71) +
           auVar110._14_2_;
      auVar96 = auVar96 ^ auVar87;
      auVar83 = auVar83 ^ auVar110;
      auVar54 = pshuflw(ZEXT416((uint)cdef_pri_taps[bVar32][0]),
                        ZEXT416((uint)cdef_pri_taps[bVar32][0]),0);
      sVar53 = auVar54._0_2_;
      sVar61 = auVar54._2_2_;
      uVar2 = *(undefined8 *)(in + lVar28);
      uVar3 = *(undefined8 *)(in + lVar28 + 0x90);
      uVar4 = *(undefined8 *)(in + lVar28 + 0x120);
      uVar5 = *(undefined8 *)(in + lVar28 + 0x1b0);
      auVar91._0_2_ = (short)uVar3 - sVar44;
      auVar91._2_2_ = (short)((ulong)uVar3 >> 0x10) - sVar45;
      auVar91._4_2_ = (short)((ulong)uVar3 >> 0x20) - sVar46;
      auVar91._6_2_ = (short)((ulong)uVar3 >> 0x30) - sVar47;
      auVar91._8_2_ = (short)uVar2 - sVar48;
      auVar91._10_2_ = (short)((ulong)uVar2 >> 0x10) - sVar49;
      auVar91._12_2_ = (short)((ulong)uVar2 >> 0x20) - sVar50;
      auVar91._14_2_ = (short)((ulong)uVar2 >> 0x30) - sVar51;
      auVar103._0_2_ = (short)uVar5 - sVar36;
      auVar103._2_2_ = (short)((ulong)uVar5 >> 0x10) - sVar37;
      auVar103._4_2_ = (short)((ulong)uVar5 >> 0x20) - sVar38;
      auVar103._6_2_ = (short)((ulong)uVar5 >> 0x30) - sVar39;
      auVar103._8_2_ = (short)uVar4 - sVar40;
      auVar103._10_2_ = (short)((ulong)uVar4 >> 0x10) - sVar41;
      auVar103._12_2_ = (short)((ulong)uVar4 >> 0x20) - sVar42;
      auVar103._14_2_ = (short)((ulong)uVar4 >> 0x30) - sVar43;
      auVar54 = pabsw(auVar132,auVar91);
      auVar73 = psraw(auVar91,0xf);
      auVar110 = pabsw(auVar134,auVar103);
      uVar52 = auVar54._0_2_;
      auVar132._0_2_ = uVar52 >> uVar34;
      uVar58 = auVar54._2_2_;
      auVar132._2_2_ = uVar58 >> uVar34;
      uVar60 = auVar54._4_2_;
      auVar132._4_2_ = uVar60 >> uVar34;
      uVar62 = auVar54._6_2_;
      auVar132._6_2_ = uVar62 >> uVar34;
      uVar64 = auVar54._8_2_;
      auVar132._8_2_ = uVar64 >> uVar34;
      uVar66 = auVar54._10_2_;
      auVar132._10_2_ = uVar66 >> uVar34;
      uVar68 = auVar54._12_2_;
      uVar70 = auVar54._14_2_;
      auVar132._12_2_ = uVar68 >> uVar34;
      auVar132._14_2_ = uVar70 >> uVar34;
      auVar87 = psraw(auVar103,0xf);
      uVar119 = auVar110._0_2_;
      auVar139._0_2_ = uVar119 >> uVar34;
      uVar125 = auVar110._2_2_;
      auVar139._2_2_ = uVar125 >> uVar34;
      uVar126 = auVar110._4_2_;
      auVar139._4_2_ = uVar126 >> uVar34;
      uVar127 = auVar110._6_2_;
      auVar139._6_2_ = uVar127 >> uVar34;
      uVar128 = auVar110._8_2_;
      auVar139._8_2_ = uVar128 >> uVar34;
      uVar129 = auVar110._10_2_;
      auVar139._10_2_ = uVar129 >> uVar34;
      uVar130 = auVar110._12_2_;
      uVar131 = auVar110._14_2_;
      auVar139._12_2_ = uVar130 >> uVar34;
      auVar139._14_2_ = uVar131 >> uVar34;
      auVar110 = psubusw(auVar33,auVar132);
      auVar54 = psubusw(auVar33,auVar139);
      sVar77 = auVar110._0_2_;
      sVar78 = auVar110._2_2_;
      sVar79 = auVar110._4_2_;
      sVar80 = auVar110._6_2_;
      sVar81 = auVar110._8_2_;
      sVar82 = auVar110._10_2_;
      sVar108 = auVar110._12_2_;
      sVar109 = auVar110._14_2_;
      sVar59 = auVar54._0_2_;
      sVar63 = auVar54._2_2_;
      sVar65 = auVar54._4_2_;
      sVar67 = auVar54._6_2_;
      sVar69 = auVar54._8_2_;
      sVar71 = auVar54._10_2_;
      sVar72 = auVar54._12_2_;
      sVar76 = auVar54._14_2_;
      auVar118._0_2_ =
           (((short)uVar52 < sVar77) * uVar52 | (ushort)((short)uVar52 >= sVar77) * sVar77) +
           auVar73._0_2_;
      auVar118._2_2_ =
           (((short)uVar58 < sVar78) * uVar58 | (ushort)((short)uVar58 >= sVar78) * sVar78) +
           auVar73._2_2_;
      auVar118._4_2_ =
           (((short)uVar60 < sVar79) * uVar60 | (ushort)((short)uVar60 >= sVar79) * sVar79) +
           auVar73._4_2_;
      auVar118._6_2_ =
           (((short)uVar62 < sVar80) * uVar62 | (ushort)((short)uVar62 >= sVar80) * sVar80) +
           auVar73._6_2_;
      auVar118._8_2_ =
           (((short)uVar64 < sVar81) * uVar64 | (ushort)((short)uVar64 >= sVar81) * sVar81) +
           auVar73._8_2_;
      auVar118._10_2_ =
           (((short)uVar66 < sVar82) * uVar66 | (ushort)((short)uVar66 >= sVar82) * sVar82) +
           auVar73._10_2_;
      auVar118._12_2_ =
           (((short)uVar68 < sVar108) * uVar68 | (ushort)((short)uVar68 >= sVar108) * sVar108) +
           auVar73._12_2_;
      auVar118._14_2_ =
           (((short)uVar70 < sVar109) * uVar70 | (ushort)((short)uVar70 >= sVar109) * sVar109) +
           auVar73._14_2_;
      auVar134._0_2_ =
           (((short)uVar119 < sVar59) * uVar119 | (ushort)((short)uVar119 >= sVar59) * sVar59) +
           auVar87._0_2_;
      auVar134._2_2_ =
           (((short)uVar125 < sVar63) * uVar125 | (ushort)((short)uVar125 >= sVar63) * sVar63) +
           auVar87._2_2_;
      auVar134._4_2_ =
           (((short)uVar126 < sVar65) * uVar126 | (ushort)((short)uVar126 >= sVar65) * sVar65) +
           auVar87._4_2_;
      auVar134._6_2_ =
           (((short)uVar127 < sVar67) * uVar127 | (ushort)((short)uVar127 >= sVar67) * sVar67) +
           auVar87._6_2_;
      auVar134._8_2_ =
           (((short)uVar128 < sVar69) * uVar128 | (ushort)((short)uVar128 >= sVar69) * sVar69) +
           auVar87._8_2_;
      auVar134._10_2_ =
           (((short)uVar129 < sVar71) * uVar129 | (ushort)((short)uVar129 >= sVar71) * sVar71) +
           auVar87._10_2_;
      auVar134._12_2_ =
           (((short)uVar130 < sVar72) * uVar130 | (ushort)((short)uVar130 >= sVar72) * sVar72) +
           auVar87._12_2_;
      auVar134._14_2_ =
           (((short)uVar131 < sVar76) * uVar131 | (ushort)((short)uVar131 >= sVar76) * sVar76) +
           auVar87._14_2_;
      in_XMM10 = auVar118 ^ auVar73;
      auVar134 = auVar134 ^ auVar87;
      uVar2 = *(undefined8 *)(in + -lVar28);
      uVar3 = *(undefined8 *)(in + (0x90 - lVar28));
      uVar4 = *(undefined8 *)(in + (0x120 - lVar28));
      uVar5 = *(undefined8 *)(in + (0x1b0 - lVar28));
      auVar124._0_2_ = (short)uVar3 - sVar44;
      auVar124._2_2_ = (short)((ulong)uVar3 >> 0x10) - sVar45;
      auVar124._4_2_ = (short)((ulong)uVar3 >> 0x20) - sVar46;
      auVar124._6_2_ = (short)((ulong)uVar3 >> 0x30) - sVar47;
      auVar124._8_2_ = (short)uVar2 - sVar48;
      auVar124._10_2_ = (short)((ulong)uVar2 >> 0x10) - sVar49;
      auVar124._12_2_ = (short)((ulong)uVar2 >> 0x20) - sVar50;
      auVar124._14_2_ = (short)((ulong)uVar2 >> 0x30) - sVar51;
      auVar135._0_2_ = (short)uVar5 - sVar36;
      auVar135._2_2_ = (short)((ulong)uVar5 >> 0x10) - sVar37;
      auVar135._4_2_ = (short)((ulong)uVar5 >> 0x20) - sVar38;
      auVar135._6_2_ = (short)((ulong)uVar5 >> 0x30) - sVar39;
      auVar135._8_2_ = (short)uVar4 - sVar40;
      auVar135._10_2_ = (short)((ulong)uVar4 >> 0x10) - sVar41;
      auVar135._12_2_ = (short)((ulong)uVar4 >> 0x20) - sVar42;
      auVar135._14_2_ = (short)((ulong)uVar4 >> 0x30) - sVar43;
      auVar54 = pabsw(auVar139,auVar124);
      auVar87 = psraw(auVar124,0xf);
      in_XMM14 = pabsw(in_XMM14,auVar135);
      uVar34 = (ulong)uVar29;
      uVar52 = auVar54._0_2_;
      auVar104._0_2_ = uVar52 >> uVar34;
      uVar58 = auVar54._2_2_;
      auVar104._2_2_ = uVar58 >> uVar34;
      uVar60 = auVar54._4_2_;
      auVar104._4_2_ = uVar60 >> uVar34;
      uVar62 = auVar54._6_2_;
      auVar104._6_2_ = uVar62 >> uVar34;
      uVar64 = auVar54._8_2_;
      auVar104._8_2_ = uVar64 >> uVar34;
      uVar66 = auVar54._10_2_;
      auVar104._10_2_ = uVar66 >> uVar34;
      uVar68 = auVar54._12_2_;
      uVar70 = auVar54._14_2_;
      auVar104._12_2_ = uVar68 >> uVar34;
      auVar104._14_2_ = uVar70 >> uVar34;
      in_XMM12 = psraw(auVar135,0xf);
      uVar119 = in_XMM14._0_2_;
      auVar142._0_2_ = uVar119 >> uVar34;
      uVar125 = in_XMM14._2_2_;
      auVar142._2_2_ = uVar125 >> uVar34;
      uVar126 = in_XMM14._4_2_;
      auVar142._4_2_ = uVar126 >> uVar34;
      uVar127 = in_XMM14._6_2_;
      auVar142._6_2_ = uVar127 >> uVar34;
      uVar128 = in_XMM14._8_2_;
      auVar142._8_2_ = uVar128 >> uVar34;
      uVar129 = in_XMM14._10_2_;
      auVar142._10_2_ = uVar129 >> uVar34;
      uVar130 = in_XMM14._12_2_;
      uVar131 = in_XMM14._14_2_;
      auVar142._12_2_ = uVar130 >> uVar34;
      auVar142._14_2_ = uVar131 >> uVar34;
      auVar54 = psubusw(auVar33,auVar104);
      auVar73 = psubusw(auVar33,auVar142);
      sVar59 = auVar54._0_2_;
      sVar63 = auVar54._2_2_;
      sVar65 = auVar54._4_2_;
      sVar67 = auVar54._6_2_;
      sVar69 = auVar54._8_2_;
      sVar71 = auVar54._10_2_;
      sVar72 = auVar54._12_2_;
      sVar76 = auVar54._14_2_;
      sVar77 = auVar73._0_2_;
      sVar78 = auVar73._2_2_;
      sVar79 = auVar73._4_2_;
      sVar80 = auVar73._6_2_;
      sVar81 = auVar73._8_2_;
      sVar82 = auVar73._10_2_;
      sVar108 = auVar73._12_2_;
      sVar109 = auVar73._14_2_;
      auVar92._0_2_ =
           (((short)uVar52 < sVar59) * uVar52 | (ushort)((short)uVar52 >= sVar59) * sVar59) +
           auVar87._0_2_;
      auVar92._2_2_ =
           (((short)uVar58 < sVar63) * uVar58 | (ushort)((short)uVar58 >= sVar63) * sVar63) +
           auVar87._2_2_;
      auVar92._4_2_ =
           (((short)uVar60 < sVar65) * uVar60 | (ushort)((short)uVar60 >= sVar65) * sVar65) +
           auVar87._4_2_;
      auVar92._6_2_ =
           (((short)uVar62 < sVar67) * uVar62 | (ushort)((short)uVar62 >= sVar67) * sVar67) +
           auVar87._6_2_;
      auVar92._8_2_ =
           (((short)uVar64 < sVar69) * uVar64 | (ushort)((short)uVar64 >= sVar69) * sVar69) +
           auVar87._8_2_;
      auVar92._10_2_ =
           (((short)uVar66 < sVar71) * uVar66 | (ushort)((short)uVar66 >= sVar71) * sVar71) +
           auVar87._10_2_;
      auVar92._12_2_ =
           (((short)uVar68 < sVar72) * uVar68 | (ushort)((short)uVar68 >= sVar72) * sVar72) +
           auVar87._12_2_;
      auVar92._14_2_ =
           (((short)uVar70 < sVar76) * uVar70 | (ushort)((short)uVar70 >= sVar76) * sVar76) +
           auVar87._14_2_;
      auVar105._0_2_ =
           (((short)uVar119 < sVar77) * uVar119 | (ushort)((short)uVar119 >= sVar77) * sVar77) +
           in_XMM12._0_2_;
      auVar105._2_2_ =
           (((short)uVar125 < sVar78) * uVar125 | (ushort)((short)uVar125 >= sVar78) * sVar78) +
           in_XMM12._2_2_;
      auVar105._4_2_ =
           (((short)uVar126 < sVar79) * uVar126 | (ushort)((short)uVar126 >= sVar79) * sVar79) +
           in_XMM12._4_2_;
      auVar105._6_2_ =
           (((short)uVar127 < sVar80) * uVar127 | (ushort)((short)uVar127 >= sVar80) * sVar80) +
           in_XMM12._6_2_;
      auVar105._8_2_ =
           (((short)uVar128 < sVar81) * uVar128 | (ushort)((short)uVar128 >= sVar81) * sVar81) +
           in_XMM12._8_2_;
      auVar105._10_2_ =
           (((short)uVar129 < sVar82) * uVar129 | (ushort)((short)uVar129 >= sVar82) * sVar82) +
           in_XMM12._10_2_;
      auVar105._12_2_ =
           (((short)uVar130 < sVar108) * uVar130 | (ushort)((short)uVar130 >= sVar108) * sVar108) +
           in_XMM12._12_2_;
      auVar105._14_2_ =
           (((short)uVar131 < sVar109) * uVar131 | (ushort)((short)uVar131 >= sVar109) * sVar109) +
           in_XMM12._14_2_;
      auVar92 = auVar92 ^ auVar87;
      auVar105 = auVar105 ^ in_XMM12;
      auVar54 = pshuflw(ZEXT416((uint)cdef_pri_taps[bVar32][1]),
                        ZEXT416((uint)cdef_pri_taps[bVar32][1]),0);
      sVar59 = auVar54._0_2_;
      sVar63 = auVar54._2_2_;
      auVar93._0_2_ =
           (auVar92._0_2_ + in_XMM10._0_2_) * sVar59 + (auVar96._0_2_ + auVar90._0_2_) * sVar53;
      auVar93._2_2_ =
           (auVar92._2_2_ + in_XMM10._2_2_) * sVar63 + (auVar96._2_2_ + auVar90._2_2_) * sVar61;
      auVar93._4_2_ =
           (auVar92._4_2_ + in_XMM10._4_2_) * sVar59 + (auVar96._4_2_ + auVar90._4_2_) * sVar53;
      auVar93._6_2_ =
           (auVar92._6_2_ + in_XMM10._6_2_) * sVar63 + (auVar96._6_2_ + auVar90._6_2_) * sVar61;
      auVar93._8_2_ =
           (auVar92._8_2_ + in_XMM10._8_2_) * sVar59 + (auVar96._8_2_ + auVar90._8_2_) * sVar53;
      auVar93._10_2_ =
           (auVar92._10_2_ + in_XMM10._10_2_) * sVar63 + (auVar96._10_2_ + auVar90._10_2_) * sVar61;
      auVar93._12_2_ =
           (auVar92._12_2_ + in_XMM10._12_2_) * sVar59 + (auVar96._12_2_ + auVar90._12_2_) * sVar53;
      auVar93._14_2_ =
           (auVar92._14_2_ + in_XMM10._14_2_) * sVar63 + (auVar96._14_2_ + auVar90._14_2_) * sVar61;
      auVar106._0_2_ =
           (auVar105._0_2_ + auVar134._0_2_) * sVar59 + (auVar83._0_2_ + auVar120._0_2_) * sVar53;
      auVar106._2_2_ =
           (auVar105._2_2_ + auVar134._2_2_) * sVar63 + (auVar83._2_2_ + auVar120._2_2_) * sVar61;
      auVar106._4_2_ =
           (auVar105._4_2_ + auVar134._4_2_) * sVar59 + (auVar83._4_2_ + auVar120._4_2_) * sVar53;
      auVar106._6_2_ =
           (auVar105._6_2_ + auVar134._6_2_) * sVar63 + (auVar83._6_2_ + auVar120._6_2_) * sVar61;
      auVar106._8_2_ =
           (auVar105._8_2_ + auVar134._8_2_) * sVar59 + (auVar83._8_2_ + auVar120._8_2_) * sVar53;
      auVar106._10_2_ =
           (auVar105._10_2_ + auVar134._10_2_) * sVar63 +
           (auVar83._10_2_ + auVar120._10_2_) * sVar61;
      auVar106._12_2_ =
           (auVar105._12_2_ + auVar134._12_2_) * sVar59 +
           (auVar83._12_2_ + auVar120._12_2_) * sVar53;
      auVar106._14_2_ =
           (auVar105._14_2_ + auVar134._14_2_) * sVar63 +
           (auVar83._14_2_ + auVar120._14_2_) * sVar61;
      auVar54 = psraw(auVar93,0xf);
      auVar73 = psraw(auVar106,0xf);
      auVar94._0_2_ = auVar93._0_2_ + auVar35._0_2_ + auVar54._0_2_;
      auVar94._2_2_ = auVar93._2_2_ + auVar35._2_2_ + auVar54._2_2_;
      auVar94._4_2_ = auVar93._4_2_ + auVar35._4_2_ + auVar54._4_2_;
      auVar94._6_2_ = auVar93._6_2_ + auVar35._6_2_ + auVar54._6_2_;
      auVar94._8_2_ = auVar93._8_2_ + auVar35._8_2_ + auVar54._8_2_;
      auVar94._10_2_ = auVar93._10_2_ + auVar35._10_2_ + auVar54._10_2_;
      auVar94._12_2_ = auVar93._12_2_ + auVar35._12_2_ + auVar54._12_2_;
      auVar94._14_2_ = auVar93._14_2_ + auVar35._14_2_ + auVar54._14_2_;
      auVar54 = psraw(auVar94,4);
      *(short *)((long)dest + 8) = auVar54._8_2_ + sVar48;
      *(short *)((long)dest + 10) = auVar54._10_2_ + sVar49;
      *(short *)((long)dest + 0xc) = auVar54._12_2_ + sVar50;
      *(short *)((long)dest + 0xe) = auVar54._14_2_ + sVar51;
      auVar107._0_2_ = auVar106._0_2_ + auVar35._0_2_ + auVar73._0_2_;
      auVar107._2_2_ = auVar106._2_2_ + auVar35._2_2_ + auVar73._2_2_;
      auVar107._4_2_ = auVar106._4_2_ + auVar35._4_2_ + auVar73._4_2_;
      auVar107._6_2_ = auVar106._6_2_ + auVar35._6_2_ + auVar73._6_2_;
      auVar107._8_2_ = auVar106._8_2_ + auVar35._8_2_ + auVar73._8_2_;
      auVar107._10_2_ = auVar106._10_2_ + auVar35._10_2_ + auVar73._10_2_;
      auVar107._12_2_ = auVar106._12_2_ + auVar35._12_2_ + auVar73._12_2_;
      auVar107._14_2_ = auVar106._14_2_ + auVar35._14_2_ + auVar73._14_2_;
      auVar73 = psraw(auVar107,4);
      in_XMM9._0_8_ =
           CONCAT26(auVar73._6_2_ + sVar39,
                    CONCAT24(auVar73._4_2_ + sVar38,
                             CONCAT22(auVar73._2_2_ + sVar37,auVar73._0_2_ + sVar36)));
      in_XMM9._8_2_ = auVar73._8_2_ + sVar40;
      in_XMM9._10_2_ = auVar73._10_2_ + sVar41;
      in_XMM9._12_2_ = auVar73._12_2_ + sVar42;
      in_XMM9._14_2_ = auVar73._14_2_ + sVar43;
      psVar1 = (short *)((long)dest + lVar30 * 2);
      *psVar1 = auVar54._0_2_ + sVar44;
      psVar1[1] = auVar54._2_2_ + sVar45;
      psVar1[2] = auVar54._4_2_ + sVar46;
      psVar1[3] = auVar54._6_2_ + sVar47;
      *(long *)((long)dest + lVar30 * 4) = in_XMM9._8_8_;
      *(undefined8 *)((long)dest + lVar30 * 6) = in_XMM9._0_8_;
      dest = (void *)((long)dest + lVar30 * 8);
      in = in + 0x240;
    }
  }
  return;
}

Assistant:

void SIMD_FUNC(cdef_filter_16_1)(void *dest, int dstride, const uint16_t *in,
                                 int pri_strength, int sec_strength, int dir,
                                 int pri_damping, int sec_damping,
                                 int coeff_shift, int block_width,
                                 int block_height) {
  if (block_width == 8) {
    filter_block_8x8(/*is_lowbd=*/0, dest, dstride, in, pri_strength,
                     sec_strength, dir, pri_damping, sec_damping, coeff_shift,
                     block_height, /*enable_primary=*/1,
                     /*enable_secondary=*/0);
  } else {
    filter_block_4x4(/*is_lowbd=*/0, dest, dstride, in, pri_strength,
                     sec_strength, dir, pri_damping, sec_damping, coeff_shift,
                     block_height, /*enable_primary=*/1,
                     /*enable_secondary=*/0);
  }
}